

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall r_exec::View::mod(View *this,uint16_t member_index,double value)

{
  undefined6 in_register_00000032;
  
  switch((int)CONCAT62(in_register_00000032,member_index)) {
  case 3:
    this->acc_sln = (float)((double)this->acc_sln + value);
    this->sln_changes = this->sln_changes + 1;
    return;
  case 4:
    mod_res(this,value);
    return;
  case 7:
    this->acc_act = (float)((double)this->acc_act + value);
    this->act_changes = this->act_changes + 1;
    return;
  case 8:
    this->acc_vis = (float)((double)this->acc_vis + value);
    this->vis_changes = this->vis_changes + 1;
  }
  return;
}

Assistant:

void View::mod(uint16_t member_index, double value)
{
    switch (member_index) {
    case VIEW_SLN:
        mod_sln(value);
        break;

    case VIEW_RES:
        mod_res(value);
        break;

    case VIEW_ACT:
        mod_act(value);
        break;

    case GRP_VIEW_VIS:
        mod_vis(value);
        break;
    }
}